

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalcrules.cpp
# Opt level: O2

void __thiscall fmcalc::init_profile_rec(fmcalc *this,fm_profile *f)

{
  vector<tc_rec,_std::allocator<tc_rec>_> *this_00;
  uchar tc_id;
  pointer ppVar1;
  long lVar2;
  long lStack_40;
  profile_rec_new p;
  
  this_00 = &p.tc_vec;
  p.step_id = -1;
  p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  p.calcrule_id = f->calcrule_id;
  lStack_40 = 8;
  tc_id = '\0';
  switch(p.calcrule_id) {
  case 1:
  case 3:
  case 4:
  case 5:
  case 9:
  case 0xf:
  case 0x21:
    break;
  case 2:
  case 0x11:
  case 0x12:
    add_tc('\0',f->deductible1,this_00);
    tc_id = '\x04';
    lStack_40 = 0x18;
  case 0x22:
    add_tc(tc_id,*(OASIS_FLOAT *)((long)&f->profile_id + lStack_40),this_00);
    add_tc('\x06',f->share1,this_00);
    tc_id = '\x03';
    lStack_40 = 0x14;
  case 6:
  case 0xc:
  case 0x10:
  case 0x14:
    goto switchD_0010cf87_caseD_6;
  case 7:
  case 0x1a:
  case 0x23:
  case 0x24:
    add_tc('\0',f->deductible1,this_00);
    add_tc('\x01',f->deductible2,this_00);
    tc_id = '\x02';
    lStack_40 = 0x10;
    break;
  case 8:
    add_tc('\0',f->deductible1,this_00);
    tc_id = '\x01';
    lStack_40 = 0xc;
    break;
  case 10:
    goto switchD_0010cf87_caseD_a;
  case 0xb:
    add_tc('\0',f->deductible1,this_00);
    tc_id = '\x01';
    lStack_40 = 0xc;
    goto switchD_0010cf87_caseD_6;
  case 0xd:
  case 0x13:
  case 0x15:
    add_tc('\0',f->deductible1,this_00);
    tc_id = '\x01';
    lStack_40 = 0xc;
    goto switchD_0010cf87_caseD_a;
  case 0xe:
    goto switchD_0010cf87_caseD_e;
  default:
    add_tc('\0',f->deductible1,this_00);
    add_tc('\x01',f->deductible2,this_00);
    add_tc('\x02',f->deductible3,this_00);
    add_tc('\x03',f->attachment,this_00);
    add_tc('\x04',f->limit,this_00);
  case 0x19:
    add_tc('\x06',f->share1,this_00);
    add_tc('\a',f->share2,this_00);
    tc_id = '\b';
    lStack_40 = 0x24;
    goto switchD_0010cf87_caseD_6;
  case 0x17:
    goto switchD_0010cf87_caseD_17;
  case 0x18:
    add_tc('\x03',f->attachment,this_00);
    add_tc('\x06',f->share1,this_00);
    goto switchD_0010cf87_caseD_17;
  }
switchD_0010cf87_caseD_1:
  add_tc(tc_id,*(OASIS_FLOAT *)((long)&f->profile_id + lStack_40),this_00);
switchD_0010cf87_caseD_e:
  tc_id = '\x04';
  lStack_40 = 0x18;
switchD_0010cf87_caseD_6:
  add_tc(tc_id,*(OASIS_FLOAT *)((long)&f->profile_id + lStack_40),this_00);
  ppVar1 = (this->profile_vec_new_).
           super__Vector_base<profile_rec_new,_std::allocator<profile_rec_new>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = (long)f->profile_id;
  if ((ulong)((long)(this->profile_vec_new_).
                    super__Vector_base<profile_rec_new,_std::allocator<profile_rec_new>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppVar1 >> 5) < lVar2 + 1U) {
    std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>::resize
              (&this->profile_vec_new_,(long)(f->profile_id + 1));
    lVar2 = (long)f->profile_id;
    ppVar1 = (this->profile_vec_new_).
             super__Vector_base<profile_rec_new,_std::allocator<profile_rec_new>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  profile_rec_new::operator=(ppVar1 + lVar2,&p);
  std::_Vector_base<tc_rec,_std::allocator<tc_rec>_>::~_Vector_base
            (&this_00->super__Vector_base<tc_rec,_std::allocator<tc_rec>_>);
  return;
switchD_0010cf87_caseD_17:
  add_tc('\a',f->share2,this_00);
  tc_id = '\b';
  lStack_40 = 0x24;
  goto switchD_0010cf87_caseD_1;
switchD_0010cf87_caseD_a:
  add_tc(tc_id,*(OASIS_FLOAT *)((long)&f->profile_id + lStack_40),this_00);
  tc_id = '\x02';
  lStack_40 = 0x10;
  goto switchD_0010cf87_caseD_6;
}

Assistant:

void fmcalc::init_profile_rec(fm_profile &f)
{
	profile_rec_new p;
	p.calcrule_id = f.calcrule_id;
	switch (p.calcrule_id) {
		case 1:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 2:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			add_tc(share_1, f.share1, p.tc_vec);
			add_tc(attachment_1, f.attachment, p.tc_vec);
			break;
		case 3:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 4:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 5:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 6:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			break;
		case 7:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(deductible_2, f.deductible2, p.tc_vec);
			add_tc(deductible_3, f.deductible3, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 8:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(deductible_2, f.deductible2, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 9:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 10:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(deductible_3, f.deductible3, p.tc_vec);
			break;
		case 11:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(deductible_2, f.deductible2, p.tc_vec);
			break;
		case 12:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			break;
		case 13:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(deductible_2, f.deductible2, p.tc_vec);
			add_tc(deductible_3, f.deductible3, p.tc_vec);
			break;
		case 14:
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 15:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 16:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			break;
		case 17:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			add_tc(share_1, f.share1, p.tc_vec);
			add_tc(attachment_1, f.attachment, p.tc_vec);
			break;
		case 18:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			add_tc(share_1, f.share1, p.tc_vec);
			add_tc(attachment_1, f.attachment, p.tc_vec);
			break;
		case 19:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(deductible_2, f.deductible2, p.tc_vec);
			add_tc(deductible_3, f.deductible3, p.tc_vec);
			break;
		case 20:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			break;
		case 21:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(deductible_2, f.deductible2, p.tc_vec);
			add_tc(deductible_3, f.deductible3, p.tc_vec);
			break;
		case 23:
			add_tc(share_2, f.share2, p.tc_vec);
			add_tc(share_3, f.share3, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 24:
			add_tc(attachment_1, f.attachment, p.tc_vec);
			add_tc(share_1, f.share1, p.tc_vec);
			add_tc(share_2, f.share2, p.tc_vec);
			add_tc(share_3, f.share3, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 25:
			add_tc(share_1, f.share1, p.tc_vec);
			add_tc(share_2, f.share2, p.tc_vec);
			add_tc(share_3, f.share3, p.tc_vec);
			break;
		case 26:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(deductible_2, f.deductible2, p.tc_vec);
			add_tc(deductible_3, f.deductible3, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 33:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 34:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(share_1, f.share1, p.tc_vec);
			add_tc(attachment_1, f.attachment, p.tc_vec);
			break;
		case 35:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(deductible_2, f.deductible2, p.tc_vec);
			add_tc(deductible_3, f.deductible3, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 36:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(deductible_2, f.deductible2, p.tc_vec);
			add_tc(deductible_3, f.deductible3, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		default:
		{
			//fprintf(stderr, "Found calrule %d\n", p.calcrule_id);
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(deductible_2, f.deductible2, p.tc_vec);
			add_tc(deductible_3, f.deductible3, p.tc_vec);
			add_tc(attachment_1, f.attachment, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			add_tc(share_1, f.share1, p.tc_vec);
			add_tc(share_2, f.share2, p.tc_vec);
			add_tc(share_3, f.share3, p.tc_vec);
		}

	}
	if (profile_vec_new_.size() < (size_t)f.profile_id + 1) {
		profile_vec_new_.resize(f.profile_id + 1);
	}
	profile_vec_new_[f.profile_id] = p;
}